

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnn2table.cpp
# Opt level: O0

float __thiscall
QuantizeData::compute_kl_divergence
          (QuantizeData *this,vector<float,_std::allocator<float>_> *dist_a,
          vector<float,_std::allocator<float>_> *dist_b)

{
  float fVar1;
  float fVar2;
  size_type sVar3;
  const_reference pvVar4;
  vector<float,_std::allocator<float>_> *in_RDX;
  vector<float,_std::allocator<float>_> *in_RSI;
  double dVar5;
  int i;
  float result;
  int length;
  undefined4 local_24;
  undefined4 local_20;
  
  sVar3 = std::vector<float,_std::allocator<float>_>::size(in_RSI);
  local_20 = 0.0;
  for (local_24 = 0; local_24 < (int)sVar3; local_24 = local_24 + 1) {
    pvVar4 = std::vector<float,_std::allocator<float>_>::operator[](in_RSI,(long)local_24);
    if ((*pvVar4 != 0.0) || (NAN(*pvVar4))) {
      pvVar4 = std::vector<float,_std::allocator<float>_>::operator[](in_RDX,(long)local_24);
      if ((*pvVar4 != 0.0) || (NAN(*pvVar4))) {
        pvVar4 = std::vector<float,_std::allocator<float>_>::operator[](in_RSI,(long)local_24);
        fVar1 = *pvVar4;
        pvVar4 = std::vector<float,_std::allocator<float>_>::operator[](in_RSI,(long)local_24);
        fVar2 = *pvVar4;
        pvVar4 = std::vector<float,_std::allocator<float>_>::operator[](in_RDX,(long)local_24);
        dVar5 = std::log((double)(ulong)(uint)(fVar2 / *pvVar4));
        local_20 = fVar1 * SUB84(dVar5,0) + local_20;
      }
      else {
        local_20 = local_20 + 1.0;
      }
    }
  }
  return local_20;
}

Assistant:

float QuantizeData::compute_kl_divergence(const std::vector<float> &dist_a, const std::vector<float> &dist_b) 
{
    const int length = dist_a.size();
    assert(dist_b.size() == length);
    float result = 0;

    for (int i=0; i<length; i++) 
    {
        if (dist_a[i] != 0) 
        {
            if (dist_b[i] == 0) 
            {
                result += 1;
            } 
            else 
            {
                result += dist_a[i] * log(dist_a[i] / dist_b[i]);
            }
        }
    }

    return result;
}